

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Version * Catch::libraryVersion(void)

{
  uint uVar1;
  undefined4 uVar2;
  int iVar3;
  Version *in_RDI;
  
  if (libraryVersion()::version == '\0') {
    iVar3 = __cxa_guard_acquire(&libraryVersion()::version);
    if (iVar3 != 0) {
      Version::Version(&libraryVersion::version,1,9,3,"",0);
      __cxa_guard_release(&libraryVersion()::version);
    }
  }
  uVar1 = libraryVersion::version.minorVersion;
  in_RDI->majorVersion = libraryVersion::version.majorVersion;
  in_RDI->minorVersion = uVar1;
  uVar2 = libraryVersion::version._12_4_;
  in_RDI->patchNumber = libraryVersion::version.patchNumber;
  *(undefined4 *)&in_RDI->field_0xc = uVar2;
  in_RDI->branchName = libraryVersion::version.branchName;
  uVar2 = libraryVersion::version._28_4_;
  in_RDI->buildNumber = libraryVersion::version.buildNumber;
  *(undefined4 *)&in_RDI->field_0x1c = uVar2;
  return in_RDI;
}

Assistant:

inline Version libraryVersion() {
        static Version version( 1, 9, 3, "", 0 );
        return version;
    }